

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O1

int big_file_mpi_create_block
              (BigFile *bf,BigBlock *block,char *blockname,char *dtype,int nmemb,int Nfile,
              size_t size,MPI_Comm comm)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long alStack_50 [3];
  undefined8 uStack_38;
  
  uStack_38._4_4_ = nmemb;
  uVar5 = (ulong)(uint)Nfile;
  lVar1 = -(uVar5 * 8 + 0xf & 0xfffffffffffffff0);
  if (0 < Nfile) {
    uVar3 = 0;
    uVar4 = 0;
    do {
      *(ulong *)((long)&uStack_38 + lVar1 + uVar3 * 8) = (size + uVar4) / uVar5 - uVar4 / uVar5;
      uVar3 = uVar3 + 1;
      uVar4 = size + uVar4;
    } while (uVar5 != uVar3);
  }
  iVar2 = uStack_38._4_4_;
  *(MPI_Comm *)((long)alStack_50 + lVar1 + 0x10) = comm;
  *(long *)((long)alStack_50 + lVar1 + 8) = (long)&uStack_38 + lVar1;
  *(undefined8 *)((long)alStack_50 + lVar1) = 0x1046e9;
  iVar2 = _big_file_mpi_create_block
                    (bf,block,blockname,dtype,iVar2,Nfile,*(size_t **)((long)alStack_50 + lVar1 + 8)
                     ,*(MPI_Comm *)((long)alStack_50 + lVar1 + 0x10));
  return iVar2;
}

Assistant:

int
_big_file_mpi_create_block(BigFile * bf,
        BigBlock * block,
        const char * blockname,
        const char * dtype,
        int nmemb,
        int Nfile,
        const size_t fsize[],
        MPI_Comm comm)
{
    if(comm == MPI_COMM_NULL) return 0;
    int rank;
    MPI_Comm_rank(comm, &rank);

    int rt = 0;
    if (rank == 0) {
        rt = _big_file_mksubdir_r(bf->basename, blockname);
    } else {
        rt = 0;
    }

    BCAST_AND_RAISEIF(rt, comm);

    char * basename = alloca(strlen(bf->basename) + strlen(blockname) + 128);
    sprintf(basename, "%s/%s/", bf->basename, blockname);
    return _big_block_mpi_create(block, basename, dtype, nmemb, Nfile, fsize, comm);
}